

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfadop.h
# Opt level: O2

value_type __thiscall
TFadBinaryMul<TFadExpr<TFadFuncSin<TFad<6,_double>_>_>,_TFad<6,_double>_>::dx
          (TFadBinaryMul<TFadExpr<TFadFuncSin<TFad<6,_double>_>_>,_TFad<6,_double>_> *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar1 = (this->left_->fadexpr_).expr_.dx_[i];
  dVar4 = cos((this->left_->fadexpr_).expr_.val_);
  dVar2 = this->right_->dx_[i];
  dVar3 = this->right_->val_;
  dVar5 = sin((this->left_->fadexpr_).expr_.val_);
  return dVar5 * dVar2 + dVar4 * dVar1 * dVar3;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}